

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lgc.cpp
# Opt level: O2

GCObject ** sweeplist(lua_State *L,GCObject **p,lu_mem count)

{
  lu_int32 *plVar1;
  byte bVar2;
  global_State *pgVar3;
  GCObject *c;
  GCObject *pGVar4;
  Node *osize;
  bool bVar5;
  
  pgVar3 = L->l_G;
  bVar2 = pgVar3->currentwhite;
switchD_0010b7ef_default:
  while( true ) {
    c = ((CClosure *)p)->next;
    if ((c == (GCObject *)0x0) || (bVar5 = count == 0, count = count - 1, bVar5)) {
      return (GCObject **)(Closure *)p;
    }
    if ((c->gch).tt == '\b') {
      sweeplist(L,&(c->th).openupval,0xfffffffffffffffd);
    }
    if ((byte)(((c->gch).marked ^ 3) & (bVar2 ^ 3)) == 0) break;
    (c->gch).marked = pgVar3->currentwhite & 3 | (c->gch).marked & 0xf8;
    p = (GCObject **)c;
  }
  pGVar4 = (c->gch).next;
  ((CClosure *)p)->next = pGVar4;
  if (c == pgVar3->rootgc) {
    pgVar3->rootgc = pGVar4;
  }
  switch((c->gch).tt) {
  case '\x04':
    plVar1 = &(L->l_G->strt).nuse;
    *plVar1 = *plVar1 - 1;
    osize = (Node *)((long)&((c->h).metatable)->array + 1);
    break;
  case '\x05':
    luaH_free(L,&c->h);
    goto switchD_0010b7ef_default;
  case '\x06':
    luaF_freeclosure(L,&c->cl);
    goto switchD_0010b7ef_default;
  case '\a':
    osize = (c->h).node + 1;
    break;
  case '\b':
    luaE_freethread(L,&c->th);
    goto switchD_0010b7ef_default;
  case '\t':
    luaF_freeproto(L,&c->p);
    goto switchD_0010b7ef_default;
  case '\n':
    luaF_freeupval(L,&c->uv);
  default:
    goto switchD_0010b7ef_default;
  }
  luaM_realloc_(L,c,(size_t)osize,0);
  goto switchD_0010b7ef_default;
}

Assistant:

static GCObject **sweeplist (lua_State *L, GCObject **p, lu_mem count) {
  GCObject *curr;
  global_State *g = G(L);
  int deadmask = otherwhite(g);
  while ((curr = *p) != NULL && count-- > 0) {
    if (curr->gch.tt == LUA_TTHREAD)  /* sweep open upvalues of each thread */
      sweepwholelist(L, &gco2th(curr)->openupval);
    if ((curr->gch.marked ^ WHITEBITS) & deadmask) {  /* not dead? */
      lua_assert(!isdead(g, curr) || testbit(curr->gch.marked, FIXEDBIT));
      makewhite(g, curr);  /* make it white (for next cycle) */
      p = &curr->gch.next;
    }
    else {  /* must erase `curr' */
      lua_assert(isdead(g, curr) || deadmask == bitmask(SFIXEDBIT));
      *p = curr->gch.next;
      if (curr == g->rootgc)  /* is the first element of the list? */
        g->rootgc = curr->gch.next;  /* adjust first */
      freeobj(L, curr);
    }
  }
  return p;
}